

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall
slack::_detail::Slacking::Slacking(Slacking *this,string *token,bool throw_exception)

{
  allocator local_51;
  allocator local_50 [32];
  
  std::__cxx11::string::string((string *)this,"https://slack.com/api/",local_50);
  Session::Session(&this->session_,throw_exception);
  std::__cxx11::string::string((string *)&this->token_,(string *)token);
  this->throw_exception_ = throw_exception;
  (this->api).slack_ = this;
  (this->conversations).slack_ = this;
  CategoryChat::CategoryChat(&this->chat,this);
  (this->users).slack_ = this;
  CategoryWebHook::CategoryWebHook(&this->hook,this);
  std::__cxx11::string::string((string *)local_50,"https://slack.com/api/",&local_51);
  std::__cxx11::string::_M_assign((string *)&(this->session_).url_);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::_M_assign((string *)&(this->session_).token_);
  return;
}

Assistant:

Slacking(const std::string& token, bool throw_exception = true) 
    : session_{throw_exception}, token_{token}, throw_exception_{throw_exception}
    {
        session_.SetUrl("https://slack.com/api/");
        session_.SetToken(token_);
    }